

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::rollDice(Dice *this)

{
  mapped_type *pmVar1;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_48;
  int local_18;
  DiceOptions local_14;
  int i;
  DiceOptions value;
  Dice *this_local;
  
  _i = this;
  for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
    local_14 = randomDiceOption(this);
    pmVar1 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,&local_14);
    *pmVar1 = *pmVar1 + 1;
  }
  resolveDuringHand(this);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&local_48,&this->DiceValues);
  storeDiceResult(this,&local_48);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~map(&local_48);
  resetDiceValuesMap(this);
  this->numberOfRolls = this->numberOfRolls + -1;
  return;
}

Assistant:

void Dice::rollDice(){
    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    resolveDuringHand();

    storeDiceResult(DiceValues);
    resetDiceValuesMap();
    this->numberOfRolls--;
}